

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.cpp
# Opt level: O0

QString * QMakeMetaInfo::checkLib(QString *lib)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  uVar3 = QFile::exists(in_RSI);
  if ((uVar3 & 1) == 0) {
    QString::QString((QString *)0x322503);
  }
  else {
    QString::QString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  bVar2 = QString::isNull((QString *)0x32250d);
  if (bVar2) {
    if (Option::debug_level != 0) {
      QString::toLatin1(in_stack_ffffffffffffff78);
      pcVar4 = QByteArray::constData((QByteArray *)0x322538);
      debug_msg_internal(2,"QMakeMetaInfo: Cannot find info file for %s",pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x322558);
    }
  }
  else if (Option::debug_level != 0) {
    QString::toLatin1(in_stack_ffffffffffffff78);
    pcVar4 = QByteArray::constData((QByteArray *)0x32257f);
    QString::toLatin1(in_stack_ffffffffffffff78);
    pcVar5 = QByteArray::constData((QByteArray *)0x32259d);
    debug_msg_internal(2,"QMakeMetaInfo: Found info file %s for %s",pcVar4,pcVar5);
    QByteArray::~QByteArray((QByteArray *)0x3225c2);
    QByteArray::~QByteArray((QByteArray *)0x3225cc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString
QMakeMetaInfo::checkLib(const QString &lib)
{
    QString ret = QFile::exists(lib) ? lib : QString();
    if(ret.isNull()) {
        debug_msg(2, "QMakeMetaInfo: Cannot find info file for %s", lib.toLatin1().constData());
    } else {
        debug_msg(2, "QMakeMetaInfo: Found info file %s for %s", ret.toLatin1().constData(), lib.toLatin1().constData());
    }
    return ret;
}